

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
embree::TutorialScene::add(TutorialScene *this,Ref<embree::SceneGraph::GroupNode> *group)

{
  bool bVar1;
  long *in_RSI;
  Ref<embree::SceneGraph::PerspectiveCameraNode> cameraNode;
  Ref<embree::SceneGraph::LightNode> lightNode;
  Ref<embree::SceneGraph::Node> *node;
  iterator __end1;
  iterator __begin1;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *__range1;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_fffffffffffffec8;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_stack_fffffffffffffed0;
  value_type *in_stack_fffffffffffffed8;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  *in_stack_fffffffffffffee0;
  pointer local_100;
  PerspectiveCameraNode *local_e0;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  local_c8;
  value_type local_b0;
  reference local_a8;
  Ref<embree::SceneGraph::Node> *local_a0;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  local_98;
  long local_90;
  reference local_70;
  value_type *local_68;
  value_type *local_60;
  reference local_58;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  *local_50;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  *local_48;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  *local_40;
  value_type *local_30;
  pointer local_20;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  *local_18;
  PerspectiveCameraNode *local_10;
  value_type *local_8;
  
  local_90 = *in_RSI + 0x68;
  local_98._M_current =
       (Ref<embree::SceneGraph::Node> *)
       std::
       vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
       ::begin(in_stack_fffffffffffffec8);
  local_a0 = (Ref<embree::SceneGraph::Node> *)
             std::
             vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ::end(in_stack_fffffffffffffec8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_fffffffffffffed0,
                            (__normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)in_stack_fffffffffffffec8), bVar1) {
    local_a8 = __gnu_cxx::
               __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator*(&local_98);
    local_68 = &local_b0;
    local_70 = local_a8;
    if (local_a8->ptr == (Node *)0x0) {
      local_e0 = (PerspectiveCameraNode *)0x0;
    }
    else {
      local_e0 = (PerspectiveCameraNode *)
                 __dynamic_cast(local_a8->ptr,&SceneGraph::Node::typeinfo,
                                &SceneGraph::LightNode::typeinfo,0);
    }
    local_8 = &local_b0;
    local_10 = local_e0;
    local_b0.ptr = local_e0;
    if (local_e0 != (PerspectiveCameraNode *)0x0) {
      (*(local_e0->super_Node).super_RefCount._vptr_RefCount[2])();
    }
    local_60 = &local_b0;
    if (local_b0.ptr == (PerspectiveCameraNode *)0x0) {
      local_50 = &local_c8;
      local_58 = local_a8;
      if (local_a8->ptr == (Node *)0x0) {
        local_100 = (pointer)0x0;
      }
      else {
        local_100 = (pointer)__dynamic_cast(local_a8->ptr,&SceneGraph::Node::typeinfo,
                                            &SceneGraph::PerspectiveCameraNode::typeinfo,0);
      }
      local_18 = &local_c8;
      local_20 = local_100;
      local_c8.
      super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_100;
      if (local_100 != (pointer)0x0) {
        (**(code **)&(local_100->ptr->super_Node).fileName)();
      }
      local_48 = &local_c8;
      if (local_c8.
          super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
        ::push_back((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                     *)in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
      }
      else {
        std::
        vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
        ::push_back((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                     *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      }
      in_stack_fffffffffffffee0 = &local_c8;
      local_40 = in_stack_fffffffffffffee0;
      if (local_c8.
          super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)((local_c8.
                    super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->ptr->super_Node).fileName.
                  _M_string_length)();
      }
    }
    else {
      std::
      vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
      ::push_back(in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
    }
    in_stack_fffffffffffffed8 = &local_b0;
    local_30 = in_stack_fffffffffffffed8;
    if (local_b0.ptr != (PerspectiveCameraNode *)0x0) {
      (*((local_b0.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
    }
    __gnu_cxx::
    __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
    ::operator++(&local_98);
  }
  return;
}

Assistant:

void TutorialScene::add(Ref<SceneGraph::GroupNode> group) 
  {
    for (auto& node : group->children) 
    {
      if (Ref<SceneGraph::LightNode> lightNode = node.dynamicCast<SceneGraph::LightNode>()) {
        lights.push_back(lightNode);
      } 
      else if (Ref<SceneGraph::PerspectiveCameraNode> cameraNode = node.dynamicCast<SceneGraph::PerspectiveCameraNode>()) {
        cameras.push_back(cameraNode);
      } 
      else {
        geometries.push_back(node);
      }
    }
  }